

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-file-to-buffer.c
# Opt level: O0

cc_bool LoadFileToBuffer(char *file_name,uchar **p_file_buffer,size_t *p_file_size)

{
  FILE *__stream;
  size_t __size;
  uchar *__ptr;
  uchar *file_buffer;
  size_t file_size;
  FILE *file;
  cc_bool success;
  size_t *p_file_size_local;
  uchar **p_file_buffer_local;
  char *file_name_local;
  
  file._7_1_ = '\0';
  __stream = fopen(file_name,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __size = ftell(__stream);
    rewind(__stream);
    __ptr = (uchar *)malloc(__size);
    if (__ptr != (uchar *)0x0) {
      fread(__ptr,__size,1,__stream);
      if (p_file_buffer != (uchar **)0x0) {
        *p_file_buffer = __ptr;
      }
      if (p_file_size != (size_t *)0x0) {
        *p_file_size = __size;
      }
      file._7_1_ = '\x01';
    }
    fclose(__stream);
  }
  return file._7_1_;
}

Assistant:

cc_bool LoadFileToBuffer(const char* const file_name, unsigned char** const p_file_buffer, size_t* const p_file_size)
{
	cc_bool success = cc_false;

	FILE* const file = fopen(file_name, "rb");

	if (file != NULL)
	{
		size_t file_size;
		unsigned char *file_buffer;

		fseek(file, 0, SEEK_END);
		file_size = ftell(file);
		rewind(file);

		file_buffer = (unsigned char*)malloc(file_size);

		if (file_buffer != NULL)
		{
			fread(file_buffer, file_size, 1, file);

			if (p_file_buffer != NULL)
				*p_file_buffer = file_buffer;

			if (p_file_size != NULL)
				*p_file_size = file_size;

			success = cc_true;
		}

		fclose(file);
	}

	return success;
}